

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashCursorKey(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
                    void *pUserData)

{
  int rc;
  mem_hash_cursor *pMem;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  unqlite_kv_cursor *pCursor_local;
  
  if (pCursor[1].pStore == (unqlite_kv_engine *)0x0) {
    pCursor_local._4_4_ = -0x12;
  }
  else {
    pCursor_local._4_4_ =
         (*xConsumer)(pCursor[1].pStore[2].pIo,*(uint *)&pCursor[1].pStore[3].pIo,pUserData);
  }
  return pCursor_local._4_4_;
}

Assistant:

static int MemHashCursorKey(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	int rc;
	if( pMem->pCur == 0){
		 return UNQLITE_EOF;
	}
	/* Invoke the callback */
	rc = xConsumer(pMem->pCur->pKey,pMem->pCur->nKeyLen,pUserData);
	/* Callback result */
	return rc;
}